

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O1

void __thiscall xray_re::xr_scene_details::load(xr_scene_details *this,xr_reader *r)

{
  undefined8 *puVar1;
  uint uVar2;
  uint *puVar3;
  byte *pbVar4;
  uint8_t *puVar5;
  undefined8 uVar6;
  size_t sVar7;
  detail_slot_v3 *pdVar8;
  xr_reader *this_00;
  ulong uVar9;
  uint32_t id;
  ulong uVar10;
  uint32_t version;
  xr_reader *s;
  read_detail local_65;
  int local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_union_8_7_9f64dffd_for_xr_reader_2 local_40;
  xr_reader *local_38;
  
  xr_scene_revision::load(&(this->super_xr_scene_part).m_revision,r);
  sVar7 = xr_reader::r_raw_chunk(r,0x1000,&local_64,4);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x42,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  if (local_64 != 3) {
    __assert_fail("version == DETMGR_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x43,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  xr_reader::r_raw_chunk(r,0x1006,&this->m_flags,4);
  sVar7 = xr_reader::find_chunk(r,0);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x47,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  details_header::load(&this->m_header,r);
  sVar7 = xr_reader::find_chunk(r,2);
  if (sVar7 != 0) {
    puVar3 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    uVar2 = *puVar3;
    this->m_num_slots = uVar2;
    if ((ulong)uVar2 != 0) {
      if (uVar2 != (this->m_header).size_z * (this->m_header).size_x) {
        __assert_fail("m_num_slots == m_header.size_x*m_header.size_z",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                      ,0x4e,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
      }
      uVar10 = (ulong)uVar2 << 4;
      pdVar8 = (detail_slot_v3 *)operator_new__(uVar10);
      this->m_slots = pdVar8;
      uVar9 = 0;
      puVar5 = (r->field_2).m_p;
      do {
        uVar6 = *(undefined8 *)(puVar5 + 8);
        puVar1 = (undefined8 *)(&((detail_slot_v3 *)(pdVar8->palette + -4))->field_0x0 + uVar9);
        *puVar1 = *(undefined8 *)puVar5;
        puVar1[1] = uVar6;
        (r->field_2).m_p = puVar5 + 0x10;
        uVar9 = uVar9 + 0x10;
        puVar5 = puVar5 + 0x10;
      } while (uVar10 != uVar9);
    }
    this_00 = xr_reader::open_chunk(r,1);
    local_38 = this_00;
    if (this_00 != (xr_reader *)0x0) {
      local_60._M_dataplus._M_p = (pointer)xr_reader::open_chunk(this_00,0);
      if ((xr_reader *)local_60._M_dataplus._M_p != (xr_reader *)0x0) {
        id = 1;
        do {
          local_40.m_p = (uint8_t *)0x0;
          std::vector<xray_re::detail_object*,std::allocator<xray_re::detail_object*>>::
          emplace_back<xray_re::detail_object*>
                    ((vector<xray_re::detail_object*,std::allocator<xray_re::detail_object*>> *)
                     &this->m_objects,(detail_object **)&local_40.m_p);
          read_detail::operator()
                    (&local_65,
                     (this->m_objects).
                     super__Vector_base<xray_re::detail_object_*,_std::allocator<xray_re::detail_object_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,
                     (xr_reader *)local_60._M_dataplus._M_p);
          xr_reader::close_chunk(this_00,(xr_reader **)&local_60);
          local_60._M_dataplus._M_p = (pointer)xr_reader::open_chunk(this_00,id);
          id = id + 1;
        } while ((xr_reader *)local_60._M_dataplus._M_p != (xr_reader *)0x0);
      }
      xr_reader::close_chunk(r,&local_38);
    }
    sVar7 = xr_reader::find_chunk(r,0x1003);
    if (sVar7 != 0) {
      pbVar4 = (r->field_2).m_p;
      (r->field_2).m_p = pbVar4 + 1;
      uVar9 = (ulong)*pbVar4;
      std::vector<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>::reserve
                (&this->m_indices,uVar9);
      if (uVar9 != 0) {
        do {
          local_60._M_dataplus._M_p = (pointer)0x0;
          std::vector<xray_re::color_index*,std::allocator<xray_re::color_index*>>::
          emplace_back<xray_re::color_index*>
                    ((vector<xray_re::color_index*,std::allocator<xray_re::color_index*>> *)
                     &this->m_indices,(color_index **)&local_60);
          read_color_index::operator()
                    ((read_color_index *)&local_40,
                     (this->m_indices).
                     super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,r);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      sVar7 = xr_reader::r_raw_chunk(r,0x1001,&this->m_bbox,0x18);
      if (sVar7 != 0) {
        sVar7 = xr_reader::find_chunk(r,0x1004);
        if (sVar7 != 0) {
          puVar3 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
          uVar9 = (ulong)*puVar3;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve(&this->m_snap_objects,uVar9);
          if (uVar9 != 0) {
            do {
              local_60._M_string_length = 0;
              local_60.field_2._M_local_buf[0] = '\0';
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &this->m_snap_objects,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,
                                CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                         local_60.field_2._M_local_buf[0]) + 1);
              }
              uVar9 = uVar9 - 1;
              xr_reader::r_sz(r,(this->m_snap_objects).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
            } while (uVar9 != 0);
          }
        }
        xr_reader::r_raw_chunk(r,0x1005,&this->m_density,4);
        sVar7 = xr_reader::find_chunk(r,0x1002);
        if (sVar7 != 0) {
          xr_reader::r_sz(r,&this->m_texture);
        }
        return;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                    ,0x60,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                  ,0x5b,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                ,0x4c,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
}

Assistant:

void xr_scene_details::load(xr_reader& r)
{
	revision().load(r);

	uint32_t version;
	if (!r.r_chunk<uint32_t>(DETMGR_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == DETMGR_VERSION);

	r.r_chunk<uint32_t>(DETMGR_CHUNK_FLAGS, m_flags);
	if (!r.find_chunk(DETMGR_CHUNK_HEADER))
		xr_not_expected();
	m_header.load(r);
	r.debug_find_chunk();

	if (!r.find_chunk(DETMGR_CHUNK_SLOTS))
		xr_not_expected();
	if ((m_num_slots = r.r_u32())) {
		xr_assert(m_num_slots == m_header.size_x*m_header.size_z);
		m_slots = new detail_slot_v3[m_num_slots];
		r.r_cseq(m_num_slots, m_slots);
	}
	r.debug_find_chunk();

	xr_reader* s = r.open_chunk(DETMGR_CHUNK_OBJECTS);
	if (s) {
		s->r_chunks(m_objects, read_detail());
		r.close_chunk(s);
	}

	if (!r.find_chunk(DETMGR_CHUNK_COLOR_INDEX))
		xr_not_expected();
	r.r_seq(r.r_u8(), m_indices, read_color_index());
	r.debug_find_chunk();

	if (!r.r_chunk(DETMGR_CHUNK_BBOX, m_bbox))
		xr_not_expected();

	if (r.find_chunk(DETMGR_CHUNK_SNAP_OBJECTS))
		r.r_seq(r.r_u32(), m_snap_objects, xr_reader::f_r_sz());

	r.r_chunk(DETMGR_CHUNK_DENSITY, m_density);

	if (r.find_chunk(DETMGR_CHUNK_TEXTURE)) {
		r.r_sz(m_texture);
		r.debug_find_chunk();
	}
}